

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drill_2.cpp
# Opt level: O2

void __thiscall Date::Date(Date *this,int y,int m,int d)

{
  bool bVar1;
  undefined8 extraout_RAX;
  stringstream ss;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  stringstream local_190 [16];
  ostream local_180 [376];
  
  this->y = y;
  this->m = m;
  this->d = d;
  bVar1 = is_valid(this);
  if (bVar1) {
    return;
  }
  std::__cxx11::stringstream::stringstream(local_190);
  operator<<(local_180,this);
  std::__cxx11::stringbuf::str();
  std::operator+(&local_1b0,&local_1d0," is not a valid date");
  error(&local_1b0);
  std::__cxx11::string::~string((string *)&local_1b0);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::stringstream::~stringstream(local_190);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

Date::Date(int y, int m, int d): y{y}, m{m}, d{d}
{
	if (!is_valid(*this))
	{
		std::stringstream ss;
		ss << *this;
		error(ss.str() + " is not a valid date");
	}
}